

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O1

int input_huffman(uchar *infile)

{
  uint uVar1;
  int iVar2;
  undefined *puVar3;
  uint uVar4;
  uint uVar5;
  
  if (bits_to_go < 3) {
    buffer2 = (uint)infile[nextchar] | buffer2 << 8;
    nextchar = nextchar + 1;
    bits_to_go = bits_to_go + 8;
  }
  bits_to_go = bits_to_go + -3;
  uVar4 = buffer2 >> ((byte)bits_to_go & 0x1f) & 7;
  if (uVar4 < 4) {
    return 1 << (sbyte)uVar4;
  }
  if (bits_to_go == 0) {
    buffer2 = (int)infile[nextchar];
    nextchar = nextchar + 1;
    bits_to_go = 8;
  }
  bits_to_go = bits_to_go - 1;
  uVar4 = (uint)(((uint)buffer2 >> (bits_to_go & 0x1fU) & 1) != 0) + uVar4 * 2;
  if ((uVar4 < 0xd) && (uVar5 = uVar4 - 8, uVar5 < 5)) {
    puVar3 = &DAT_001d93fc;
  }
  else {
    if (bits_to_go == 0) {
      buffer2 = (int)infile[nextchar];
      nextchar = nextchar + 1;
      bits_to_go = 8;
    }
    bits_to_go = bits_to_go - 1;
    uVar1 = (uint)(((uint)buffer2 >> (bits_to_go & 0x1fU) & 1) != 0);
    uVar5 = (uVar1 + uVar4 * 2) - 0x1a;
    if (4 < uVar5) {
      if (bits_to_go == 0) {
        buffer2 = (int)infile[nextchar];
        nextchar = nextchar + 1;
        bits_to_go = 8;
      }
      bits_to_go = bits_to_go - 1;
      iVar2 = 0xe;
      if ((uint)(((uint)buffer2 >> (bits_to_go & 0x1fU) & 1) != 0) + (uVar1 + uVar4 * 2) * 2 == 0x3e
         ) {
        iVar2 = 0;
      }
      return iVar2;
    }
    puVar3 = &DAT_001d9410;
  }
  return *(int *)(puVar3 + (ulong)uVar5 * 4);
}

Assistant:

static int input_nbits(unsigned char *infile, int n)
{
    /* AND mask for retreiving the right-most n bits */
    static int mask[9] = {0, 1, 3, 7, 15, 31, 63, 127, 255};

	if (bits_to_go < n) {
		/*
		 * need another byte's worth of bits
		 */

		buffer2 = (buffer2<<8) | (int) infile[nextchar];
		nextchar++;
		bits_to_go += 8;
	}
	/*
	 * now pick off the first n bits
	 */
	bits_to_go -= n;

        /* there was a slight gain in speed by replacing the following line */
/*	return( (buffer2>>bits_to_go) & ((1<<n)-1) ); */
	return( (buffer2>>bits_to_go) & (*(mask+n)) ); 
}